

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

void VRSHFT(int NN,int L3,double *ZR,double *ZI,int *CONV,double *SR,double *SI,double *PR,
           double *PI,double *QPR,double *QPI,double *PVR,double *PVI,double ARE,double MRE,
           double ETA,double INFIN,double *HR,double *HI,double *QHR,double *QHI,double *SHR,
           double *SHI,double *TR,double *TI)

{
  double dVar1;
  double dVar2;
  int local_b0;
  int local_ac;
  int j;
  int i;
  int BOOL;
  int B;
  double TP;
  double R2;
  double R1;
  double RELSTP;
  double OMP;
  double MS;
  double MP;
  double INFIN_local;
  double ETA_local;
  double MRE_local;
  double ARE_local;
  double *SR_local;
  int *CONV_local;
  double *ZI_local;
  double *ZR_local;
  int L3_local;
  int NN_local;
  
  *SR = *ZR;
  *SI = *ZI;
  i = 0;
  *CONV = 0;
  local_ac = 0;
  MP = INFIN;
  INFIN_local = ETA;
  ETA_local = MRE;
  MRE_local = ARE;
  ARE_local = (double)SR;
  SR_local = (double *)CONV;
  CONV_local = (int *)ZI;
  ZI_local = ZR;
  ZR_local._0_4_ = L3;
  ZR_local._4_4_ = NN;
  while( true ) {
    if ((int)ZR_local <= local_ac) {
      return;
    }
    POLYEV(ZR_local._4_4_,(double *)ARE_local,SI,PR,PI,QPR,QPI,PVR,PVI);
    MS = CMOD(PVR,PVI);
    OMP = CMOD((double *)ARE_local,SI);
    dVar2 = MS;
    dVar1 = ERREV(ZR_local._4_4_,QPR,QPI,OMP,MS,MRE_local,ETA_local);
    if (dVar2 <= dVar1 * 20.0) break;
    if (local_ac == 0) {
      RELSTP = MS;
    }
    else if (((i == 1) || (MS < RELSTP)) || (0.05 <= R1)) {
      if (RELSTP < MS * 0.1) {
        return;
      }
      RELSTP = MS;
    }
    else {
      _BOOL = R1;
      i = 1;
      if (R1 < INFIN_local) {
        _BOOL = INFIN_local;
      }
      R2 = sqrt(_BOOL);
      TP = *(double *)ARE_local * (R2 + 1.0) + -(*SI * R2);
      *SI = *(double *)ARE_local * R2 + *SI * (R2 + 1.0);
      *(double *)ARE_local = TP;
      POLYEV(ZR_local._4_4_,(double *)ARE_local,SI,PR,PI,QPR,QPI,PVR,PVI);
      for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
        CALCT(&j,ZR_local._4_4_,(double *)ARE_local,SI,HR,HI,QHR,QHI,MRE_local,MP,PVR,PVI,TR,TI);
        NEXTH(&j,ZR_local._4_4_,QHR,QHI,QPR,QPI,TR,TI,HR,HI);
      }
      RELSTP = MP;
    }
    CALCT(&j,ZR_local._4_4_,(double *)ARE_local,SI,HR,HI,QHR,QHI,MRE_local,MP,PVR,PVI,TR,TI);
    NEXTH(&j,ZR_local._4_4_,QHR,QHI,QPR,QPI,TR,TI,HR,HI);
    CALCT(&j,ZR_local._4_4_,(double *)ARE_local,SI,HR,HI,QHR,QHI,MRE_local,MP,PVR,PVI,TR,TI);
    if (j == 0) {
      dVar2 = CMOD(TR,TI);
      dVar1 = CMOD((double *)ARE_local,SI);
      R1 = dVar2 / dVar1;
      *(double *)ARE_local = *(double *)ARE_local + *TR;
      *SI = *SI + *TI;
    }
    local_ac = local_ac + 1;
  }
  *(undefined4 *)SR_local = 1;
  *ZI_local = *(double *)ARE_local;
  *(double *)CONV_local = *SI;
  return;
}

Assistant:

static void VRSHFT(int NN, int L3, double *ZR, double *ZI, int *CONV,double *SR, double *SI,double *PR, double *PI, double *QPR, double *QPI, double *PVR, double *PVI,
	double ARE, double MRE, double ETA, double INFIN, double *HR, double *HI, double *QHR, double *QHI, double *SHR, double *SHI, double *TR, double *TI) {
	/*
	C CARRIES OUT THE THIRD STAGE ITERATION.
	C L3 - LIMIT OF STEPS IN STAGE 3.
	C ZR,ZI   - ON ENTRY CONTAINS THE INITIAL ITERATE, IF THE
	C ITERATION CONVERGES IT CONTAINS THE FINAL ITERATE
	C ON EXIT.
	C CONV    -  .TRUE. IF ITERATION CONVERGES
	*/
	double MP, MS, OMP, RELSTP, R1, R2, TP;
	int B,BOOL,i,j;
	*SR = *ZR;
	*SI = *ZI;
	B = 0;
	*CONV = 0;


	for (i = 0; i < L3; ++i) {
		POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
		MP = CMOD(PVR,PVI);
		MS = CMOD(SR, SI);
		if (MP <= 20.0*ERREV(NN, QPR, QPI, MS, MP, ARE, MRE)) {
			*CONV = 1;
			*ZR = *SR;
			*ZI = *SI;
			break;
		}
		else {//10
			if (i == 0) {
				OMP = MP;
			}
			else {
				if (!(B == 1 || MP < OMP || RELSTP >= .05)) {
					TP = RELSTP;
					B = 1;
					if (RELSTP < ETA) {
						TP = ETA;
					}
					R1 = sqrt(TP);
					R2 = *SR * (1.0 + R1) - *SI*R1;
					*SI = *SR*R1 + *SI*(1.0 + R1);
					*SR = R2;
					POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
					for (j = 0; j < 5;++j) {
						CALCT(&BOOL,NN,SR,SI,HR,HI,QHR, QHI,ARE,INFIN,PVR, PVI,TR,TI);
						NEXTH(&BOOL,NN,QHR,QHI,QPR,QPI,TR, TI, HR,HI);
					}
					OMP = INFIN;
				}
				else {
					if (MP*0.1 > OMP) {
						break;
					}
					OMP = MP;
				}

			}

			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);
			NEXTH(&BOOL, NN, QHR, QHI, QPR, QPI, TR, TI, HR, HI);
			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);

			if (BOOL == 0) {
				RELSTP = CMOD(TR, TI) / CMOD(SR, SI);
				*SR = *SR + *TR;
				*SI = *SI + *TI;
			}

		}
	}//60
}